

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_leaflist(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node **siblings)

{
  lysp_node *plVar1;
  LY_ERR LVar2;
  lysp_node *llist_00;
  char *pcVar3;
  ly_ctx *local_110;
  ly_ctx *local_100;
  ly_ctx *local_f8;
  ly_ctx *local_e0;
  char *local_d8;
  ly_ctx *local_c8;
  ly_ctx *local_c0;
  ly_ctx *local_b8;
  LY_ERR ret___14;
  LY_ERR ret___13;
  LY_ERR ret___12;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  long *plStack_70;
  LY_ERR ret__;
  char **iter__;
  size_t offset__;
  char *p__;
  lysp_node_leaflist *llist;
  size_t sStack_48;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_node **pplStack_28;
  LY_ERR ret;
  lysp_node **siblings_local;
  lysp_node *parent_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_28 = siblings;
  siblings_local = &parent->parent;
  parent_local = (lysp_node *)ctx;
  llist_00 = (lysp_node *)calloc(1,0xd0);
  if (llist_00 == (lysp_node *)0x0) {
    if (parent_local == (lysp_node *)0x0) {
      local_b8 = (ly_ctx *)0x0;
    }
    else {
      local_b8 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    ly_log(local_b8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_leaflist");
    return LY_EMEM;
  }
  if (*pplStack_28 == (lysp_node *)0x0) {
    *pplStack_28 = llist_00;
  }
  else {
    plVar1 = *pplStack_28;
    while (plStack_70 = (long *)((long)plVar1 + (long)*pplStack_28 + (0x10 - (long)*pplStack_28)),
          *plStack_70 != 0) {
      plVar1 = (lysp_node *)*plStack_70;
    }
    *plStack_70 = (long)llist_00;
  }
  llist_00->nodetype = 8;
  llist_00->parent = (lysp_node *)siblings_local;
  LVar2 = get_argument((lysp_yang_ctx *)parent_local,Y_IDENTIF_ARG,(uint16_t *)0x0,
                       (char **)&word_len,&word,&stack0xffffffffffffffb8);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if (word == (char *)0x0) {
    if (parent_local == (lysp_node *)0x0) {
      local_c8 = (ly_ctx *)0x0;
    }
    else {
      local_c8 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    if (sStack_48 == 0) {
      local_d8 = "";
    }
    else {
      local_d8 = (char *)word_len;
    }
    buf._4_4_ = lydict_insert(local_c8,local_d8,sStack_48,&llist_00->name);
  }
  else {
    if (parent_local == (lysp_node *)0x0) {
      local_c0 = (ly_ctx *)0x0;
    }
    else {
      local_c0 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    buf._4_4_ = lydict_insert_zc(local_c0,(char *)word_len,&llist_00->name);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    buf._4_4_ = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&llist + 4),
                            (char **)&word_len,&stack0xffffffffffffffb8);
    if (buf._4_4_ == LY_SUCCESS) {
      if (llist._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
        ret___2._3_1_ = 1;
        LVar2 = buf._4_4_;
      }
      else {
        if (llist._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (parent_local == (lysp_node *)0x0) {
            local_e0 = (ly_ctx *)0x0;
          }
          else {
            local_e0 = *(ly_ctx **)
                        **(undefined8 **)
                          (parent_local->exts->argument +
                          (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
          }
          pcVar3 = lyplg_ext_stmt2str(llist._4_4_);
          ly_vlog(local_e0,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar3);
          return LY_EVALID;
        }
        LVar2 = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&llist + 4),
                            (char **)&word_len,&stack0xffffffffffffffb8);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        ret___2._3_1_ = llist._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        LVar2 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar2, !(bool)ret___2._3_1_) {
        if (llist._4_4_ == LY_STMT_CONFIG) {
          LVar2 = parse_config((lysp_yang_ctx *)parent_local,&llist_00->flags,&llist_00->exts);
        }
        else if (llist._4_4_ == LY_STMT_DEFAULT) {
          if (*(byte *)(*(long *)(parent_local->exts->argument +
                                 (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8) +
                       0x78) < 2) {
            if (parent_local == (lysp_node *)0x0) {
              local_f8 = (ly_ctx *)0x0;
            }
            else {
              local_f8 = *(ly_ctx **)
                          **(undefined8 **)
                            (parent_local->exts->argument +
                            (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
            }
            ly_vlog(local_f8,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ,"default","leaf-list");
            return LY_EVALID;
          }
          LVar2 = parse_qnames((lysp_yang_ctx *)parent_local,LY_STMT_DEFAULT,
                               (lysp_qname **)(llist_00 + 3),Y_STR_ARG,&llist_00->exts);
        }
        else if (llist._4_4_ == LY_STMT_DESCRIPTION) {
          LVar2 = parse_text_field((lysp_yang_ctx *)parent_local,llist_00->dsc,LY_STMT_DESCRIPTION,0
                                   ,&llist_00->dsc,Y_STR_ARG,(uint16_t *)0x0,&llist_00->exts);
        }
        else if (llist._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
          LVar2 = parse_ext((lysp_yang_ctx *)parent_local,(char *)word_len,sStack_48,llist_00,
                            LY_STMT_LEAF_LIST,0,&llist_00->exts);
        }
        else if (llist._4_4_ == LY_STMT_IF_FEATURE) {
          LVar2 = parse_qnames((lysp_yang_ctx *)parent_local,LY_STMT_IF_FEATURE,
                               &llist_00->iffeatures,Y_STR_ARG,&llist_00->exts);
        }
        else if (llist._4_4_ == LY_STMT_MAX_ELEMENTS) {
          LVar2 = parse_maxelements((lysp_yang_ctx *)parent_local,(uint32_t *)&llist_00[3].field_0xc
                                    ,&llist_00->flags,&llist_00->exts);
        }
        else if (llist._4_4_ == LY_STMT_MIN_ELEMENTS) {
          LVar2 = parse_minelements((lysp_yang_ctx *)parent_local,(uint32_t *)&llist_00[3].nodetype,
                                    &llist_00->flags,&llist_00->exts);
        }
        else if (llist._4_4_ == LY_STMT_MUST) {
          LVar2 = parse_restrs((lysp_yang_ctx *)parent_local,LY_STMT_MUST,
                               (lysp_restr **)(llist_00 + 1));
        }
        else if (llist._4_4_ == LY_STMT_ORDERED_BY) {
          LVar2 = parse_orderedby((lysp_yang_ctx *)parent_local,llist_00);
        }
        else if (llist._4_4_ == LY_STMT_REFERENCE) {
          LVar2 = parse_text_field((lysp_yang_ctx *)parent_local,llist_00->ref,LY_STMT_REFERENCE,0,
                                   &llist_00->ref,Y_STR_ARG,(uint16_t *)0x0,&llist_00->exts);
        }
        else if (llist._4_4_ == LY_STMT_STATUS) {
          LVar2 = parse_status((lysp_yang_ctx *)parent_local,&llist_00->flags,&llist_00->exts);
        }
        else if (llist._4_4_ == LY_STMT_TYPE) {
          LVar2 = parse_type((lysp_yang_ctx *)parent_local,(lysp_type *)&llist_00[1].next);
        }
        else if (llist._4_4_ == LY_STMT_UNITS) {
          LVar2 = parse_text_field((lysp_yang_ctx *)parent_local,llist_00[2].exts,LY_STMT_UNITS,0,
                                   (char **)&llist_00[2].exts,Y_STR_ARG,(uint16_t *)0x0,
                                   &llist_00->exts);
        }
        else {
          if (llist._4_4_ != LY_STMT_WHEN) {
            if (parent_local == (lysp_node *)0x0) {
              local_100 = (ly_ctx *)0x0;
            }
            else {
              local_100 = *(ly_ctx **)
                           **(undefined8 **)
                             (parent_local->exts->argument +
                             (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
            }
            pcVar3 = lyplg_ext_stmt2str(llist._4_4_);
            ly_vlog(local_100,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,"llist");
            return LY_EVALID;
          }
          LVar2 = parse_when((lysp_yang_ctx *)parent_local,(lysp_when **)&llist_00[1].nodetype);
        }
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        buf._4_4_ = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&llist + 4),
                                (char **)&word_len,&stack0xffffffffffffffb8);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar2 = LY_SUCCESS;
        if (llist._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
          if ((llist_00->exts != (lysp_ext_instance *)0x0) &&
             (LVar2 = ly_set_add((ly_set *)&(parent_local[1].parent)->ref,llist_00->exts,'\x01',
                                 (uint32_t *)0x0), LVar2 != LY_SUCCESS)) {
            return LVar2;
          }
          buf._4_4_ = LVar2;
          ret___2._3_1_ = true;
          LVar2 = buf._4_4_;
        }
      }
      if (llist_00[1].next == (lysp_node *)0x0) {
        if (parent_local == (lysp_node *)0x0) {
          local_110 = (ly_ctx *)0x0;
        }
        else {
          local_110 = *(ly_ctx **)
                       **(undefined8 **)
                         (parent_local->exts->argument +
                         (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
        }
        ly_vlog(local_110,(char *)0x0,LYVE_SYNTAX_YANG,
                "Missing mandatory keyword \"%s\" as a child of \"%s\".","type","leaf-list");
        return LY_EVALID;
      }
    }
  }
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_leaflist(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_leaflist *llist;

    /* create new leaf-list structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, llist, next, LY_EMEM);
    llist->nodetype = LYS_LEAFLIST;
    llist->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, llist->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &llist->flags, &llist->exts));
            break;
        case LY_STMT_DEFAULT:
            PARSER_CHECK_STMTVER2_RET(ctx, "default", "leaf-list");
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_DEFAULT, &llist->dflts, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, llist->dsc, LY_STMT_DESCRIPTION, 0, &llist->dsc, Y_STR_ARG, NULL, &llist->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &llist->iffeatures, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(parse_maxelements(ctx, &llist->max, &llist->flags, &llist->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(parse_minelements(ctx, &llist->min, &llist->flags, &llist->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &llist->musts));
            break;
        case LY_STMT_ORDERED_BY:
            LY_CHECK_RET(parse_orderedby(ctx, &llist->node));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, llist->ref, LY_STMT_REFERENCE, 0, &llist->ref, Y_STR_ARG, NULL, &llist->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &llist->flags, &llist->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(parse_type(ctx, &llist->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(parse_text_field(ctx, llist->units, LY_STMT_UNITS, 0, &llist->units, Y_STR_ARG, NULL, &llist->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &llist->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, llist, LY_STMT_LEAF_LIST, 0, &llist->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "llist");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, llist->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!llist->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "leaf-list");
        return LY_EVALID;
    }

cleanup:
    return ret;
}